

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3VdbeMemSetNull(Mem *pMem)

{
  ushort uVar1;
  undefined2 uVar2;
  RowSet *pRVar3;
  
  uVar1 = pMem->flags;
  if ((uVar1 & 0x40) != 0) {
    pRVar3 = (pMem->u).pRowSet;
    pRVar3->db = (sqlite3 *)pRVar3->pChunk->aEntry[9].pRight;
    pRVar3->pChunk->aEntry[9].pRight = (RowSetEntry *)pRVar3;
  }
  if ((uVar1 & 0x20) != 0) {
    sqlite3RowSetClear((pMem->u).pRowSet);
  }
  uVar2 = pMem->flags;
  pMem->flags = (uVar2 & 0xbe00) + 1;
  pMem->type = '\x05';
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeMemSetNull(Mem *pMem){
  if( pMem->flags & MEM_Frame ){
    VdbeFrame *pFrame = pMem->u.pFrame;
    pFrame->pParent = pFrame->v->pDelFrame;
    pFrame->v->pDelFrame = pFrame;
  }
  if( pMem->flags & MEM_RowSet ){
    sqlite3RowSetClear(pMem->u.pRowSet);
  }
  MemSetTypeFlag(pMem, MEM_Null);
  pMem->type = SQLITE_NULL;
}